

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O0

void __thiscall StringPieceUtilTestJoinStringPiece::Run(StringPieceUtilTestJoinStringPiece *this)

{
  Test *pTVar1;
  bool bVar2;
  string local_238;
  StringPiece local_218;
  undefined1 local_208 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_2;
  undefined1 local_1e8 [8];
  string sep;
  StringPiece local_1a8;
  undefined1 local_198 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> single_list;
  undefined1 local_178 [8];
  string one;
  undefined1 local_138 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> empty_list;
  StringPiece local_100;
  undefined1 local_f0 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list_1;
  undefined1 local_d0 [8];
  string empty;
  string local_90;
  StringPiece local_70;
  undefined1 local_60 [8];
  vector<StringPiece,_std::allocator<StringPiece>_> list;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string input;
  StringPieceUtilTestJoinStringPiece *this_local;
  
  input.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"a:b:c",&local_31);
  std::allocator<char>::~allocator(&local_31);
  StringPiece::StringPiece(&local_70,(string *)local_30);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,local_70,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            (&local_90,(vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,':');
  bVar2 = std::operator==("a:b:c",&local_90);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x50,"\"a:b:c\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string((string *)&local_90);
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            ((string *)((long)&empty.field_2 + 8),
             (vector<StringPiece,_std::allocator<StringPiece>_> *)local_60,'/');
  bVar2 = std::operator==("a/b/c",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&empty.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x51,"\"a/b/c\" == JoinStringPiece(list, \'/\')");
  std::__cxx11::string::~string((string *)(empty.field_2._M_local_buf + 8));
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"",
             (allocator<char> *)
             ((long)&list_1.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list_1.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_100,(string *)local_d0);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_f0,local_100,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            ((string *)
             &empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<StringPiece,_std::allocator<StringPiece>_> *)local_f0,':');
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &empty_list.
                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x58,"\"\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string
            ((string *)
             &empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_f0);
  std::__cxx11::string::~string((string *)local_d0);
  std::vector<StringPiece,_std::allocator<StringPiece>_>::vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            ((string *)((long)&one.field_2 + 8),
             (vector<StringPiece,_std::allocator<StringPiece>_> *)local_138,':');
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&one.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x5e,"\"\" == JoinStringPiece(empty_list, \':\')");
  std::__cxx11::string::~string((string *)(one.field_2._M_local_buf + 8));
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178,"a",
             (allocator<char> *)
             ((long)&single_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&single_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_1a8,(string *)local_178);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_198,local_1a8,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            ((string *)((long)&sep.field_2 + 8),
             (vector<StringPiece,_std::allocator<StringPiece>_> *)local_198,':');
  bVar2 = std::operator==("a",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&sep.field_2 + 8));
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x65,"\"a\" == JoinStringPiece(single_list, \':\')");
  std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_198);
  std::__cxx11::string::~string((string *)local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,":a:b:c:",
             (allocator<char> *)
             ((long)&list_2.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&list_2.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  StringPiece::StringPiece(&local_218,(string *)local_1e8);
  SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_208,local_218,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_
            (&local_238,(vector<StringPiece,_std::allocator<StringPiece>_> *)local_208,':');
  bVar2 = std::operator==(":a:b:c:",&local_238);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/string_piece_util_test.cc"
             ,0x6c,"\":a:b:c:\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string((string *)&local_238);
  std::vector<StringPiece,_std::allocator<StringPiece>_>::~vector
            ((vector<StringPiece,_std::allocator<StringPiece>_> *)local_208);
  std::__cxx11::string::~string((string *)local_1e8);
  return;
}

Assistant:

TEST(StringPieceUtilTest, JoinStringPiece) {
  {
    string input("a:b:c");
    vector<StringPiece> list = SplitStringPiece(input, ':');

    EXPECT_EQ("a:b:c", JoinStringPiece(list, ':'));
    EXPECT_EQ("a/b/c", JoinStringPiece(list, '/'));
  }

  {
    string empty("");
    vector<StringPiece> list = SplitStringPiece(empty, ':');

    EXPECT_EQ("", JoinStringPiece(list, ':'));
  }

  {
    vector<StringPiece> empty_list;

    EXPECT_EQ("", JoinStringPiece(empty_list, ':'));
  }

  {
    string one("a");
    vector<StringPiece> single_list = SplitStringPiece(one, ':');

    EXPECT_EQ("a", JoinStringPiece(single_list, ':'));
  }

  {
    string sep(":a:b:c:");
    vector<StringPiece> list = SplitStringPiece(sep, ':');

    EXPECT_EQ(":a:b:c:", JoinStringPiece(list, ':'));
  }
}